

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.hpp
# Opt level: O0

void __thiscall
pstore::storage::storage<pstore::file::file_handle>
          (storage *this,shared_ptr<pstore::file::file_handle> *file)

{
  pointer pfVar1;
  shared_ptr<pstore::file::file_handle> local_40 [2];
  unique_ptr<pstore::system_page_size,_std::default_delete<pstore::system_page_size>_> local_20;
  shared_ptr<pstore::file::file_handle> *local_18;
  shared_ptr<pstore::file::file_handle> *file_local;
  storage *this_local;
  
  local_18 = file;
  file_local = (shared_ptr<pstore::file::file_handle> *)this;
  std::make_unique<std::array<pstore::sat_entry,65536ul>>();
  std::static_pointer_cast<pstore::file::file_base,pstore::file::file_handle>
            ((shared_ptr<pstore::file::file_handle> *)&this->file_);
  std::make_unique<pstore::system_page_size>();
  std::
  unique_ptr<pstore::system_page_size_interface,std::default_delete<pstore::system_page_size_interface>>
  ::unique_ptr<pstore::system_page_size,std::default_delete<pstore::system_page_size>,void>
            ((unique_ptr<pstore::system_page_size_interface,std::default_delete<pstore::system_page_size_interface>>
              *)&this->page_size_,&local_20);
  std::unique_ptr<pstore::system_page_size,_std::default_delete<pstore::system_page_size>_>::
  ~unique_ptr(&local_20);
  std::static_pointer_cast<pstore::file::file_handle,pstore::file::file_handle>(local_40);
  region::get_factory((region *)&this->region_factory_,local_40,0x100000000,0x400000);
  std::shared_ptr<pstore::file::file_handle>::~shared_ptr(local_40);
  pfVar1 = std::unique_ptr<pstore::region::factory,_std::default_delete<pstore::region::factory>_>::
           operator->(&this->region_factory_);
  (*pfVar1->_vptr_factory[2])(&this->regions_);
  return;
}

Assistant:

explicit storage (std::shared_ptr<File> const & file)
                : file_{std::static_pointer_cast<file::file_base> (file)}
                , region_factory_{region::get_factory (
                      std::static_pointer_cast<file::file_handle> (file), full_region_size,
                      min_region_size)}
                , regions_{region_factory_->init ()} {}